

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O1

bool __thiscall
QHttpSocketEngine::waitForRead(QHttpSocketEngine *this,QDeadlineTimer deadline,bool *timedOut)

{
  long lVar1;
  long *plVar2;
  QDeadlineTimer deadline_00;
  char cVar3;
  bool bVar4;
  SocketState SVar5;
  undefined4 uVar6;
  SocketError SVar7;
  long lVar8;
  long in_FS_OFFSET;
  QString local_58;
  qint64 local_40;
  undefined8 local_38;
  long local_30;
  
  local_38 = deadline._8_8_;
  local_40 = deadline.t1;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((*(QAbstractSocket **)(lVar1 + 0xf8) != (QAbstractSocket *)0x0) &&
     (SVar5 = QAbstractSocket::state(*(QAbstractSocket **)(lVar1 + 0xf8)), SVar5 != UnconnectedState
     )) {
    lVar8 = (**(code **)(**(long **)(lVar1 + 0xf8) + 0xa0))();
    if (lVar8 == 0) {
      plVar2 = *(long **)(lVar1 + 0xf8);
      uVar6 = QDeadlineTimer::remainingTime();
      cVar3 = (**(code **)(*plVar2 + 0xb8))(plVar2,uVar6);
      if (cVar3 != '\0') goto LAB_00227248;
      SVar5 = QAbstractSocket::state(*(QAbstractSocket **)(lVar1 + 0xf8));
      if (SVar5 == UnconnectedState) {
        bVar4 = true;
        goto LAB_002272ec;
      }
    }
    else {
LAB_00227248:
      deadline_00.t2 = (undefined4)local_38;
      deadline_00.type = local_38._4_4_;
      deadline_00.t1 = local_40;
      waitForProtocolHandshake(this,deadline_00);
      bVar4 = true;
      if (*(int *)(lVar1 + 0x108) == 2) goto LAB_002272ec;
    }
    SVar7 = QAbstractSocket::error(*(QAbstractSocket **)(lVar1 + 0xf8));
    QIODevice::errorString();
    QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,SVar7,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((timedOut != (bool *)0x0) &&
       (SVar7 = QAbstractSocket::error(*(QAbstractSocket **)(lVar1 + 0xf8)),
       SVar7 == SocketTimeoutError)) {
      *timedOut = true;
    }
  }
  bVar4 = false;
LAB_002272ec:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QHttpSocketEngine::waitForRead(QDeadlineTimer deadline, bool *timedOut)
{
    Q_D(const QHttpSocketEngine);

    if (!d->socket || d->socket->state() == QAbstractSocket::UnconnectedState)
        return false;

    // Wait for more data if nothing is available.
    if (!d->socket->bytesAvailable()) {
        if (!d->socket->waitForReadyRead(deadline.remainingTime())) {
            if (d->socket->state() == QAbstractSocket::UnconnectedState)
                return true;
            setError(d->socket->error(), d->socket->errorString());
            if (timedOut && d->socket->error() == QAbstractSocket::SocketTimeoutError)
                *timedOut = true;
            return false;
        }
    }

    waitForProtocolHandshake(deadline);

    // Report any error that may occur.
    if (d->state != Connected) {
        setError(d->socket->error(), d->socket->errorString());
        if (timedOut && d->socket->error() == QAbstractSocket::SocketTimeoutError)
            *timedOut = true;
        return false;
    }
    return true;
}